

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall
print_info::perform(print_info *this,filesystemcollection *fslist,readercollection *rdlist)

{
  string local_40;
  
  printf("readers: ( total = %d )\n",
         (ulong)(uint)(rdlist->_rdbyname)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  readercollection::printreadertree(rdlist,&local_40,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  printf("filesystems: ( total = %d )\n",
         (ulong)(uint)(fslist->_byname)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  filesystemcollection::
  enumerate_filesystems<print_info::perform(filesystemcollection&,readercollection&)::_lambda(std::__cxx11::string_const&,std::shared_ptr<FileContainer>)_1_>
            (fslist);
  return;
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        printf("readers: ( total = %d )\n", (int)rdlist.count());
        rdlist.printreadertree("", 0);
        printf("filesystems: ( total = %d )\n", (int)fslist.count());
        fslist.enumerate_filesystems([](const std::string& name, FileContainer_ptr fs) {
            printf("    %-10s  %s\n", name.c_str(), fs->infostring().c_str());
        });
    }